

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

HRESULT __thiscall
Js::ByteCodeBufferBuilder::AddFunction
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,ParseableFunctionInfo *function,
          SRCINFO *srcInfo,ByteCodeCache *cache)

{
  byte bVar1;
  Type value;
  ushort uVar2;
  Type TVar3;
  Type TVar4;
  Type value_00;
  NestedArray *pNVar5;
  code *pcVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  LocalScopeInfoId value_01;
  undefined4 extraout_var;
  undefined4 *puVar10;
  undefined4 extraout_var_00;
  DeferredFunctionStub *deferredStubs;
  int *piVar11;
  ScopeInfo *scopeInfo;
  BufferBuilder *pBVar12;
  FunctionInfo *pFVar13;
  BufferBuilderList *builder_00;
  _func_int **pp_Var14;
  BufferBuilder *pBVar15;
  ImmutableList<Js::BufferBuilder_*> *pIVar16;
  ParseableFunctionInfo *function_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar17;
  uint uVar18;
  uint uVar19;
  uint32 i;
  uint uVar20;
  FunctionBody *pFVar21;
  ByteCodeBufferBuilder *pBVar22;
  SerializedFieldList SVar23;
  uint32 local_54;
  FunctionBody *pFStack_50;
  uint32 sourceDiff;
  FunctionBody *local_48;
  ByteCodeBufferBuilder *local_40;
  SerializedFieldList local_38;
  SerializedFieldList definedFields;
  
  local_38 = (SerializedFieldList)0x0;
  local_54 = 0;
  uVar8 = ParseableFunctionInfo::StartOffset(function);
  bVar7 = TryConvertToUInt32((ulong)uVar8,&local_54);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x8ce,"(0)","0");
    if (bVar7) {
      *puVar10 = 0;
      return -0x7ffdfdff;
    }
LAB_008724a7:
    pcVar6 = (code *)invalidInstructionException();
    (*pcVar6)();
  }
  local_48 = (FunctionBody *)function;
  if (function->m_lineNumber == 0) {
    SVar23 = (SerializedFieldList)0x0;
  }
  else {
    SVar23 = (SerializedFieldList)0x1000000000000;
    local_38 = (SerializedFieldList)0x1000000000000;
    PrependInt32(this,builder,L"Line Number",function->m_lineNumber,(BufferBuilderInt32 **)0x0);
  }
  TVar4 = (local_48->super_ParseableFunctionInfo).m_columnNumber;
  local_40 = this;
  if (TVar4 != 0) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 0x2000000000000);
    local_38 = SVar23;
    PrependInt32(this,builder,L"Column Number",TVar4,(BufferBuilderInt32 **)0x0);
  }
  pFVar21 = local_48;
  iVar9 = (*(local_48->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(local_48);
  uVar2 = *(ushort *)&(pFVar21->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
  bVar1 = (pFVar21->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
  uVar18 = (uint)uVar2;
  uVar19 = (uint)uVar2;
  uVar20 = (uint)bVar1;
  uVar20 = ((uVar19 & 0x600 | bVar1 & 1) << 9 | (uVar19 & 0x80) << 0x12) + (uVar20 & 8) * 2 |
           (uVar20 & 2) << 9 | (uVar20 & 0x20) << 0x13 |
           (uVar18 & 0x40) << 8 |
           (uVar18 & 0x20) << 0xc |
           (uVar2 >> 1 & 4 | uVar2 >> 2 & 1) + (uVar18 & 0x10) * 4 | bVar1 >> 1 & 2 |
           (uint)((char16 *)CONCAT44(extraout_var,iVar9) == L"Anonymous function") << 0x14 |
           uVar2 >> 9 & 8 | uVar2 >> 1 & 0x80 | uVar2 >> 5 & 0x100 | (uVar19 & 0x4000) << 8 |
           (uVar19 & 0x8000) << 6;
  bVar7 = FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar21);
  if (bVar7) {
    bVar7 = FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar21);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar7) goto LAB_008724a7;
      *puVar10 = 0;
      pFVar21 = local_48;
    }
    uVar18 = *(uint *)&pFVar21->field_0x178;
    uVar20 = uVar20 | (uVar18 >> 10 & 0x800) + (uVar18 & 8) * 4 | uVar18 >> 8 & 0x1000 |
                      uVar18 >> 0xb & 0x2000 | uVar18 >> 8 & 0x8000 | uVar18 >> 9 & 0x10000 |
                      uVar18 >> 3 & 0x800000;
    pFStack_50 = pFVar21;
  }
  else {
    pFStack_50 = (FunctionBody *)0x0;
  }
  pBVar22 = local_40;
  PrependConstantInt32
            (local_40,builder,L"BitFlags",uVar20,(ConstantSizedBufferBuilderOf<int> **)0x0);
  pFVar21 = local_48;
  if ((char16 *)CONCAT44(extraout_var,iVar9) != L"Anonymous function") {
    iVar9 = (*(local_48->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(local_48);
    PrependString16(pBVar22,builder,L"Display Name",(LPCWSTR)CONCAT44(extraout_var_00,iVar9),
                    (pFVar21->super_ParseableFunctionInfo).m_displayNameLength * 2 + 2);
  }
  pFVar13 = (pFVar21->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar13 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar7) goto LAB_008724a7;
    *puVar10 = 0;
    pFVar13 = (local_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    pFVar21 = local_48;
  }
  PrependInt32(pBVar22,builder,L"Relative Function ID",pFVar13->functionId - pBVar22->topFunctionId,
               (BufferBuilderInt32 **)0x0);
  pFVar13 = (pFVar21->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar13 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar7) goto LAB_008724a7;
    *puVar10 = 0;
    pFVar13 = (pFVar21->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((FunctionBody *)(pFVar13->functionBodyImpl).ptr != pFVar21) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar7) goto LAB_008724a7;
    *puVar10 = 0;
    pFVar13 = (pFVar21->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  value_00 = pFVar13->attributes;
  if ((value_00 &
      ~(HomeObj|ComputedName|Method|BaseConstructorKind|AllowDirectSuper|CanDefer|
        EnclosedByGlobalFunc|Async|Generator|CapturesThis|Lambda|ClassConstructor|ClassMethod|
        SuperReference|DeferredParse|ErrorOnNew)) == None) {
    pBVar22 = local_40;
    if (value_00 == None) goto LAB_00871f18;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x924,
                                "((attributes & ~(FunctionInfo::Attributes::ErrorOnNew | FunctionInfo::Attributes::SuperReference | FunctionInfo::Attributes::Lambda | FunctionInfo::Attributes::Async | FunctionInfo::Attributes::CapturesThis | FunctionInfo::Attributes::Generator | FunctionInfo::Attributes::ClassConstructor | FunctionInfo::Attributes::BaseConstructorKind | FunctionInfo::Attributes::ClassMethod | FunctionInfo::Attributes::Method | FunctionInfo::Attributes::EnclosedByGlobalFunc | FunctionInfo::Attributes::AllowDirectSuper | FunctionInfo::Attributes::DeferredParse | FunctionInfo::Attributes::CanDefer | FunctionInfo::Attributes::ComputedName | FunctionInfo::Attributes::HomeObj)) == 0)"
                                ,
                                "Only the ErrorOnNew|SuperReference|Lambda|CapturesThis|Generator|ClassConstructor|BaseConstructorKind|Async|ClassMember|Method|EnclosedByGlobalFunc|AllowDirectSuper|ComputedName|DeferredParse|CanDefer|HomeObj attributes should be set on a serialized function"
                               );
    if (!bVar7) goto LAB_008724a7;
    *puVar10 = 0;
  }
  pBVar22 = local_40;
  SVar23 = (SerializedFieldList)((ulong)SVar23 | 0x4000000000000);
  local_38 = SVar23;
  PrependInt32(local_40,builder,L"Attributes",value_00,(BufferBuilderInt32 **)0x0);
LAB_00871f18:
  PrependInt32(pBVar22,builder,L"Offset Into Source",local_54,(BufferBuilderInt32 **)0x0);
  uVar8 = ParseableFunctionInfo::PrintableStartOffset(&pFVar21->super_ParseableFunctionInfo);
  PrependInt32(pBVar22,builder,L"Offset Into Source for toString",uVar8,(BufferBuilderInt32 **)0x0);
  pNVar5 = (pFVar21->super_ParseableFunctionInfo).nestedArray.ptr;
  if ((pNVar5 != (NestedArray *)0x0) && (TVar4 = pNVar5->nestedCount, TVar4 != 0)) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 0x8000000000000);
    local_38 = SVar23;
    PrependInt32(local_40,builder,L"Nested count",TVar4,(BufferBuilderInt32 **)0x0);
  }
  deferredStubs =
       (DeferredFunctionStub *)FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar21,DeferredStubs);
  if (((value_00 & DeferredParse) != None && deferredStubs != (DeferredFunctionStub *)0x0) &&
     ((local_40->dwFlags & 4) != 0)) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 0x800000000000000);
    pNVar5 = (pFVar21->super_ParseableFunctionInfo).nestedArray.ptr;
    if (pNVar5 == (NestedArray *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = pNVar5->nestedCount;
    }
    local_38 = SVar23;
    AddDeferredStubs(local_40,builder,deferredStubs,uVar8,cache,true);
  }
  piVar11 = (int *)FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar21,PrintOffsets);
  pBVar22 = local_40;
  if (piVar11 != (int *)0x0) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 0x2000000000000000);
    local_38 = SVar23;
    PrependInt32(local_40,builder,L"Start print offset",*piVar11,(BufferBuilderInt32 **)0x0);
    pFVar21 = local_48;
    PrependInt32(pBVar22,builder,L"End print offset",piVar11[1],(BufferBuilderInt32 **)0x0);
  }
  scopeInfo = (ScopeInfo *)FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar21,ScopeInfo);
  pBVar22 = local_40;
  if ((value_00 & (CanDefer|DeferredParse)) != None && scopeInfo != (ScopeInfo *)0x0) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 0x1000000000000000);
    local_38 = SVar23;
    value_01 = GetScopeInfoId(local_40,scopeInfo);
    PrependInt32(pBVar22,builder,L"ScopeInfo LocalId",value_01,(BufferBuilderInt32 **)0x0);
  }
  value = (pFVar21->super_ParseableFunctionInfo).flags;
  if (value != Flags_None) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 1);
    local_38 = SVar23;
    PrependByte(pBVar22,builder,L"flags",value);
  }
  TVar4 = (pFVar21->super_ParseableFunctionInfo).m_grfscr;
  if (TVar4 != 0) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 2);
    local_38 = SVar23;
    PrependInt32(pBVar22,builder,L"m_grfscr",TVar4,(BufferBuilderInt32 **)0x0);
  }
  TVar3 = (pFVar21->super_ParseableFunctionInfo).m_inParamCount;
  if (TVar3 != 0) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 4);
    local_38 = SVar23;
    PrependInt16(pBVar22,builder,L"m_inParamCount",TVar3,(BufferBuilderInt16 **)0x0);
  }
  TVar3 = (pFVar21->super_ParseableFunctionInfo).m_reportedInParamCount;
  if (TVar3 != 0) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 8);
    local_38 = SVar23;
    PrependInt16(pBVar22,builder,L"m_reportedInParamCount",TVar3,(BufferBuilderInt16 **)0x0);
  }
  TVar4 = (pFVar21->super_ParseableFunctionInfo).m_cchStartOffset;
  if (TVar4 != 0) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 0x10);
    local_38 = SVar23;
    PrependInt32(pBVar22,builder,L"m_cchStartOffset",TVar4,(BufferBuilderInt32 **)0x0);
  }
  TVar4 = (pFVar21->super_ParseableFunctionInfo).m_cchLength;
  if (TVar4 != 0) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 0x20);
    local_38 = SVar23;
    PrependInt32(pBVar22,builder,L"m_cchLength",TVar4,(BufferBuilderInt32 **)0x0);
  }
  TVar4 = (pFVar21->super_ParseableFunctionInfo).m_cbLength;
  if (TVar4 != 0) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 0x40);
    local_38 = SVar23;
    PrependInt32(pBVar22,builder,L"m_cbLength",TVar4,(BufferBuilderInt32 **)0x0);
  }
  TVar4 = (pFVar21->super_ParseableFunctionInfo).m_displayShortNameOffset;
  if (TVar4 != 0) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 0x80);
    local_38 = SVar23;
    PrependInt32(pBVar22,builder,L"m_displayShortNameOffset",TVar4,(BufferBuilderInt32 **)0x0);
  }
  TVar4 = (pFVar21->super_ParseableFunctionInfo).scopeSlotArraySize;
  if (TVar4 != 0) {
    SVar23 = (SerializedFieldList)((ulong)SVar23 | 0x100);
    local_38 = SVar23;
    PrependInt32(pBVar22,builder,L"scopeSlotArraySize",TVar4,(BufferBuilderInt32 **)0x0);
  }
  TVar4 = (pFVar21->super_ParseableFunctionInfo).paramScopeSlotArraySize;
  if (TVar4 != 0) {
    local_38 = (SerializedFieldList)((ulong)SVar23 | 0x200);
    PrependInt32(pBVar22,builder,L"paramScopeSlotArraySize",TVar4,(BufferBuilderInt32 **)0x0);
  }
  AddPropertyIdsForScopeSlotArray(pBVar22,builder,&pFVar21->super_ParseableFunctionInfo);
  if (pFStack_50 != (FunctionBody *)0x0) {
    AddFunctionBody(pBVar22,builder,pFStack_50,srcInfo,&local_38);
  }
  pNVar5 = (pFVar21->super_ParseableFunctionInfo).nestedArray.ptr;
  if ((pNVar5 != (NestedArray *)0x0) && (pNVar5->nestedCount != 0)) {
    uVar8 = 0;
    pBVar12 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x20,pBVar22->alloc,0x364470);
    pBVar12->clue = L"Nest Function Bodies";
    pBVar12->offset = 0xffffffff;
    pBVar12->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dd778;
    pBVar12[1]._vptr_BufferBuilder = (_func_int **)0x0;
    while( true ) {
      pNVar5 = (pFVar21->super_ParseableFunctionInfo).nestedArray.ptr;
      uVar20 = 0;
      if (pNVar5 != (NestedArray *)0x0) {
        uVar20 = pNVar5->nestedCount;
      }
      if (uVar20 <= uVar8) break;
      pFVar13 = ParseableFunctionInfo::GetNestedFunc(&pFVar21->super_ParseableFunctionInfo,uVar8);
      if (((pFVar13 == (FunctionInfo *)0x0) ||
          ((pFVar13->functionBodyImpl).ptr == (FunctionProxy *)0x0)) ||
         ((pFVar13->attributes & DeferredDeserialize) != None)) {
        PrependConstantInt32
                  (pBVar22,builder,L"Empty Nested Function",0,
                   (ConstantSizedBufferBuilderOf<int> **)0x0);
      }
      else {
        builder_00 = (BufferBuilderList *)new<Memory::ArenaAllocator>(0x20,pBVar22->alloc,0x364470);
        (builder_00->super_BufferBuilder).clue = L"Nested Function";
        (builder_00->super_BufferBuilder).offset = 0xffffffff;
        (builder_00->super_BufferBuilder)._vptr_BufferBuilder =
             (_func_int **)&PTR_FixOffset_014dd778;
        builder_00->list = (ImmutableList<Js::BufferBuilder_*> *)0x0;
        pFStack_50 = (FunctionBody *)pBVar12[1]._vptr_BufferBuilder;
        pp_Var14 = (_func_int **)new<Memory::ArenaAllocator>(0x10,pBVar22->alloc,0x364470);
        *pp_Var14 = (_func_int *)builder_00;
        pp_Var14[1] = (_func_int *)pFStack_50;
        pBVar12[1]._vptr_BufferBuilder = pp_Var14;
        pBVar15 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x28,pBVar22->alloc,0x364470);
        pBVar15->clue = L"Offset To Nested Function";
        pBVar15->offset = 0xffffffff;
        pBVar15->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dd740;
        pBVar15[1]._vptr_BufferBuilder = (_func_int **)builder_00;
        *(undefined4 *)&pBVar15[1].clue = 0;
        pIVar17 = builder->list;
        pIVar16 = (ImmutableList<Js::BufferBuilder_*> *)
                  new<Memory::ArenaAllocator>(0x10,local_40->alloc,0x364470);
        pBVar22 = local_40;
        pIVar16->value = pBVar15;
        pIVar16->next = pIVar17;
        builder->list = pIVar16;
        function_00 = FunctionInfo::GetParseableFunctionInfo(pFVar13);
        AddFunction(pBVar22,builder_00,function_00,srcInfo,cache);
      }
      uVar8 = uVar8 + 1;
      pFVar21 = local_48;
    }
    pIVar17 = builder->list;
    pIVar16 = (ImmutableList<Js::BufferBuilder_*> *)
              new<Memory::ArenaAllocator>(0x10,pBVar22->alloc,0x364470);
    pIVar16->value = pBVar12;
    pIVar16->next = pIVar17;
    builder->list = pIVar16;
  }
  pIVar17 = regex::ImmutableList<Js::BufferBuilder_*>::ReverseCurrentList(builder->list);
  builder->list = pIVar17;
  PrependStruct<Js::SerializedFieldList>(pBVar22,builder,L"Serialized Field List",&local_38);
  return 0;
}

Assistant:

HRESULT AddFunction(BufferBuilderList & builder, ParseableFunctionInfo * function, SRCINFO const * srcInfo, ByteCodeCache* cache)
    {
        SerializedFieldList definedFields = { 0 };

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        PrependInt32(builder, _u("Start Function Table"), magicStartOfFunctionBody);
#endif

        uint32 sourceDiff = 0;

        if (!TryConvertToUInt32(function->StartOffset(), &sourceDiff))
        {
            Assert(0); // Likely a bug
            return ByteCodeSerializer::CantGenerate;
        }

        if (function->m_lineNumber != 0)
        {
            definedFields.has_m_lineNumber = true;
            PrependInt32(builder, _u("Line Number"), function->m_lineNumber);
        }

        if (function->m_columnNumber != 0)
        {
            definedFields.has_m_columnNumber = true;
            PrependInt32(builder, _u("Column Number"), function->m_columnNumber);
        }

        bool isAnonymous = function->GetIsAnonymousFunction();

        // FunctionBody Details
        DWORD bitFlags =
            (function->m_isDeclaration ? ffIsDeclaration : 0)
            | (function->m_hasImplicitArgIns ? ffHasImplicitArgsIn : 0)
            | (function->m_isAccessor ? ffIsAccessor : 0)
            | (function->m_isStaticNameFunction ? ffIsStaticNameFunction : 0)
            | (function->m_isNamedFunctionExpression ? ffIsNamedFunctionExpression : 0)
            | (function->m_isNameIdentifierRef ? ffIsNameIdentifierRef : 0)
            | (function->m_isGlobalFunc ? ffIsGlobalFunc : 0)
            | (function->m_dontInline ? ffDontInline : 0)
            | (function->m_isStrictMode ? ffIsStrictMode : 0)
            | (function->m_doBackendArgumentsOptimization ? ffDoBackendArgumentsOptimization : 0)
            | (function->m_doScopeObjectCreation ? ffDoScopeObjectCreation : 0)
            | (function->m_usesArgumentsObject ? ffUsesArgumentsObject : 0)
            | (function->m_isEval ? ffIsEval : 0)
            | (function->m_isDynamicFunction ? ffIsDynamicFunction : 0)
            | (isAnonymous ? ffIsAnonymous : 0)
            | (function->m_isMethod ? ffIsMethod : 0)
            | (function->m_isClassMember ? ffIsClassMember : 0)
#ifdef ASMJS_PLAT
            | (function->m_isAsmjsMode ? ffIsAsmJsMode : 0)
            | (function->m_isAsmJsFunction ? ffIsAsmJsFunction : 0)
#endif
            ;

        FunctionBody *functionBody = nullptr;
        if (function->IsFunctionBody())
        {
            functionBody = function->GetFunctionBody();

            bitFlags |=
                (functionBody->m_isFuncRegistered ? ffIsFuncRegistered : 0)
                | (functionBody->m_hasAllNonLocalReferenced ? ffhasAllNonLocalReferenced : 0)
                | (functionBody->m_hasSetIsObject ? ffhasSetIsObject : 0)
                | (functionBody->m_CallsEval ? ffhasSetCallsEval : 0)
                | (functionBody->m_ChildCallsEval ? ffChildCallsEval : 0)
                | (functionBody->m_hasReferenceableBuiltInArguments ? ffHasReferenceableBuiltInArguments : 0)
                | (functionBody->m_isParamAndBodyScopeMerged ? ffIsParamAndBodyScopeMerged : 0);
        }

        PrependConstantInt32(builder, _u("BitFlags"), bitFlags);

        if (!isAnonymous)
        {
            const char16* displayName = function->GetDisplayName();
            uint displayNameLength = function->m_displayNameLength;
            PrependString16(builder, _u("Display Name"), displayName, (displayNameLength + 1) * sizeof(char16));
        }

        PrependInt32(builder, _u("Relative Function ID"), function->GetLocalFunctionId() - topFunctionId); // Serialized function ids are relative to the top function ID
        auto attributes = function->GetAttributes();
        AssertMsg((attributes &
            ~(FunctionInfo::Attributes::ErrorOnNew
                | FunctionInfo::Attributes::SuperReference
                | FunctionInfo::Attributes::Lambda
                | FunctionInfo::Attributes::Async
                | FunctionInfo::Attributes::CapturesThis
                | FunctionInfo::Attributes::Generator
                | FunctionInfo::Attributes::ClassConstructor
                | FunctionInfo::Attributes::BaseConstructorKind
                | FunctionInfo::Attributes::ClassMethod
                | FunctionInfo::Attributes::Method
                | FunctionInfo::Attributes::EnclosedByGlobalFunc
                | FunctionInfo::Attributes::AllowDirectSuper
                | FunctionInfo::Attributes::DeferredParse
                | FunctionInfo::Attributes::CanDefer
                | FunctionInfo::Attributes::ComputedName
                | FunctionInfo::Attributes::HomeObj)) == 0,
            "Only the ErrorOnNew|SuperReference|Lambda|CapturesThis|Generator|ClassConstructor|BaseConstructorKind|Async|ClassMember|Method|EnclosedByGlobalFunc|AllowDirectSuper|ComputedName|DeferredParse|CanDefer|HomeObj attributes should be set on a serialized function");
        if (attributes != FunctionInfo::Attributes::None)
        {
            definedFields.has_attributes = true;
            PrependInt32(builder, _u("Attributes"), attributes);
        }

        PrependInt32(builder, _u("Offset Into Source"), sourceDiff);
        PrependInt32(builder, _u("Offset Into Source for toString"), function->PrintableStartOffset());
        if (function->GetNestedCount() > 0)
        {
            definedFields.has_m_nestedCount = true;
            PrependInt32(builder, _u("Nested count"), function->GetNestedCount());
        }

        DeferredFunctionStub* deferredStubs = function->GetDeferredStubs();
        if (deferredStubs != nullptr
            && (attributes & FunctionInfo::Attributes::DeferredParse) != 0
            && GenerateParserStateCache())
        {
            definedFields.has_deferredStubs = true;
            AddDeferredStubs(builder, deferredStubs, function->GetNestedCount(), cache, true);
        }

        PrintOffsets* printOffsets = function->GetPrintOffsets();
        if (printOffsets != nullptr)
        {
            definedFields.has_printOffsets = true;
            PrependInt32(builder, _u("Start print offset"), printOffsets->cbStartPrintOffset);
            PrependInt32(builder, _u("End print offset"), printOffsets->cbEndPrintOffset);
        }

        ScopeInfo* scopeInfo = function->GetScopeInfo();
        if (scopeInfo != nullptr
            && (attributes & (FunctionInfo::Attributes::DeferredParse | FunctionInfo::Attributes::CanDefer)) != 0)
        {
            definedFields.has_scopeInfo = true;
            AddScopeInfo(builder, scopeInfo);
        }

#define PrependArgSlot PrependInt16
#define PrependRegSlot PrependInt32
#define PrependCharCount PrependInt32
#define PrependULong PrependInt32
#define PrependUInt16 PrependInt16
#define PrependUInt32 PrependInt32

#define DEFINE_FUNCTION_PROXY_FIELDS 1
#define DEFINE_PARSEABLE_FUNCTION_INFO_FIELDS 1
#define DECLARE_SERIALIZABLE_FIELD(type, name, serializableType) \
        if (function->##name != 0) { \
            definedFields.has_##name = true; \
            Prepend##serializableType(builder, _u(#name), function->##name); \
        }

#include "SerializableFunctionFields.h"

        AddPropertyIdsForScopeSlotArray(builder, function);

        if (functionBody != nullptr)
        {
            AddFunctionBody(builder, functionBody, srcInfo, definedFields);
        }

        // Lastly, write each of the lexically enclosed functions
        if (function->GetNestedCount())
        {
            auto nestedBodyList = Anew(alloc, BufferBuilderList, _u("Nest Function Bodies"));

            for (uint32 i = 0; i < function->GetNestedCount(); ++i)
            {
                auto nestedFunction = function->GetNestedFunc(i);
                if (nestedFunction == nullptr || !nestedFunction->HasParseableInfo())
                {
                    PrependConstantInt32(builder, _u("Empty Nested Function"), 0);
                }
                else
                {
                    auto nestedFunctionBuilder = Anew(alloc, BufferBuilderList, _u("Nested Function"));
                    nestedBodyList->list = nestedBodyList->list->Prepend(nestedFunctionBuilder, alloc);
                    auto offsetToNested = Anew(alloc, BufferBuilderRelativeOffset, _u("Offset To Nested Function"), nestedFunctionBuilder);
                    builder.list = builder.list->Prepend(offsetToNested, alloc);
                    AddFunction(*nestedFunctionBuilder, nestedFunction->GetParseableFunctionInfo(), srcInfo, cache);
                }
            }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
            PrependInt32(builder, _u("End Function Body"), magicEndOfFunctionBody);
#endif

            builder.list = builder.list->Prepend(nestedBodyList, alloc);
        }
        else
        {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
            PrependInt32(builder, _u("End Function Body"), magicEndOfFunctionBody);
#endif
        }

        // Reverse to put prepended items in correct order
        builder.list = builder.list->ReverseCurrentList();
        PrependStruct<SerializedFieldList>(builder, _u("Serialized Field List"), &definedFields);

        return S_OK;
    }